

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FFontChar2::MakeTexture(FFontChar2 *this)

{
  ushort uVar1;
  ushort uVar2;
  BYTE BVar3;
  uint uVar4;
  BYTE *pBVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  BYTE color;
  int local_ac;
  FFontChar2 *local_a8;
  ulong local_a0;
  BYTE buff [16];
  ulong local_78;
  FWadLump lump;
  
  FWadCollection::OpenLumpNum(&lump,&Wads,*(int *)&(this->super_FTexture).field_0x54);
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  local_a8 = this;
  FWadLump::Read(&lump,buff,4);
  if (buff[3] == '\x1a') {
    FWadLump::Read(&lump,buff,0xd);
    FWadLump::Seek(&lump,(long)local_a8->SourcePos + -0x11,1);
    bVar10 = buff[0xc] - 1;
    bVar14 = false;
  }
  else if (buff[3] == '2') {
    FWadLump::Read(&lump,buff,7);
    bVar14 = true;
    FWadLump::Seek(&lump,(long)local_a8->SourcePos + -0xb,1);
    bVar10 = buff[6];
  }
  else {
    FWadLump::Seek(&lump,(long)local_a8->SourcePos + -4,1);
    bVar10 = 0xff;
    bVar14 = true;
  }
  uVar13 = (uint)uVar2 * (uint)uVar1;
  pBVar5 = (BYTE *)operator_new__((ulong)uVar13);
  local_a8->Pixels = pBVar5;
  uVar8 = (ulong)(local_a8->super_FTexture).Height;
  lVar6 = -(long)(int)(uVar13 - 1);
  if (bVar14) {
    local_a0 = 0;
    local_ac = 0;
    local_78 = 0;
    uVar7 = uVar8;
LAB_004899a2:
    if ((int)uVar7 != 0) {
      uVar13 = (uint)(local_a8->super_FTexture).Width;
      do {
        iVar9 = 0;
        while( true ) {
          uVar4 = (int)local_a0 + iVar9;
          uVar11 = uVar13 + iVar9;
          if (uVar11 == 0) {
            pBVar5 = pBVar5 + lVar6;
            uVar7 = (ulong)((int)uVar7 - 1);
            local_a0 = (ulong)uVar4;
            goto LAB_004899a2;
          }
          uVar12 = (ulong)bVar10;
          if (uVar4 == 0) break;
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,buff,1);
          if (buff[0] < bVar10) {
            uVar12 = (ulong)buff[0];
          }
          buff[0] = (BYTE)uVar12;
          BVar3 = buff[0];
          if (local_a8->SourceRemap != (BYTE *)0x0) {
            BVar3 = local_a8->SourceRemap[uVar12];
          }
          *pBVar5 = BVar3;
          pBVar5 = pBVar5 + uVar8;
          iVar9 = iVar9 + -1;
        }
        if (local_ac == 0) {
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,buff,1);
          uVar13 = uVar11;
          if ((char)buff[0] < '\0') {
            local_a0 = 0;
            if (buff[0] == 0x80) {
              local_ac = 0;
            }
            else {
              (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&color,1);
              if (color < bVar10) {
                uVar12 = (ulong)color;
              }
              if (local_a8->SourceRemap != (BYTE *)0x0) {
                uVar12 = (ulong)local_a8->SourceRemap[uVar12];
              }
              local_ac = 1 - (char)buff[0];
              local_78 = uVar12;
            }
          }
          else {
            local_a0 = (ulong)(buff[0] + 1);
            local_ac = 0;
          }
        }
        else {
          *pBVar5 = (BYTE)local_78;
          pBVar5 = pBVar5 + uVar8;
          local_a0 = 0;
          uVar13 = (uVar13 + iVar9) - 1;
          local_ac = local_ac + -1;
        }
      } while( true );
    }
  }
  else {
    uVar7 = uVar8;
    while ((int)uVar7 != 0) {
      local_a0 = CONCAT44(local_a0._4_4_,(int)uVar7 + -1);
      uVar13 = (uint)(local_a8->super_FTexture).Width;
      while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
        (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,buff,1);
        if (bVar10 < buff[0]) {
          buff[0] = bVar10;
        }
        BVar3 = buff[0];
        if (local_a8->SourceRemap != (BYTE *)0x0) {
          BVar3 = local_a8->SourceRemap[buff[0]];
        }
        *pBVar5 = BVar3;
        pBVar5 = pBVar5 + uVar8;
      }
      pBVar5 = pBVar5 + lVar6;
      uVar7 = local_a0 & 0xffffffff;
    }
  }
  FWadLump::~FWadLump(&lump);
  return;
}

Assistant:

void FFontChar2::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	int destSize = Width * Height;
	BYTE max = 255;
	bool rle = true;

	// This is to "fix" bad fonts
	{
		BYTE buff[16];
		lump.Read (buff, 4);
		if (buff[3] == '2')
		{
			lump.Read (buff, 7);
			max = buff[6];
			lump.Seek (SourcePos - 11, SEEK_CUR);
		}
		else if (buff[3] == 0x1A)
		{
			lump.Read(buff, 13);
			max = buff[12] - 1;
			lump.Seek (SourcePos - 17, SEEK_CUR);
			rle = false;
		}
		else
		{
			lump.Seek (SourcePos - 4, SEEK_CUR);
		}
	}

	Pixels = new BYTE[destSize];

	int runlen = 0, setlen = 0;
	BYTE setval = 0;  // Shut up, GCC!
	BYTE *dest_p = Pixels;
	int dest_adv = Height;
	int dest_rew = destSize - 1;

	if (rle)
	{
		for (int y = Height; y != 0; --y)
		{
			for (int x = Width; x != 0; )
			{
				if (runlen != 0)
				{
					BYTE color;

					lump >> color;
					color = MIN (color, max);
					if (SourceRemap != NULL)
					{
						color = SourceRemap[color];
					}
					*dest_p = color;
					dest_p += dest_adv;
					x--;
					runlen--;
				}
				else if (setlen != 0)
				{
					*dest_p = setval;
					dest_p += dest_adv;
					x--;
					setlen--;
				}
				else
				{
					SBYTE code;

					lump >> code;
					if (code >= 0)
					{
						runlen = code + 1;
					}
					else if (code != -128)
					{
						BYTE color;

						lump >> color;
						setlen = (-code) + 1;
						setval = MIN (color, max);
						if (SourceRemap != NULL)
						{
							setval = SourceRemap[setval];
						}
					}
				}
			}
			dest_p -= dest_rew;
		}
	}
	else
	{
		for (int y = Height; y != 0; --y)
		{
			for (int x = Width; x != 0; --x)
			{
				BYTE color;
				lump >> color;
				if (color > max)
				{
					color = max;
				}
				if (SourceRemap != NULL)
				{
					color = SourceRemap[color];
				}
				*dest_p = color;
				dest_p += dest_adv;
			}
			dest_p -= dest_rew;
		}
	}

	if (destSize < 0)
	{
		char name[9];
		Wads.GetLumpName (name, SourceLump);
		name[8] = 0;
		I_FatalError ("The font %s is corrupt", name);
	}
}